

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void trigger_set(ecs_world_t *world,ecs_entity_t *entities,EcsTrigger *ct,int32_t count)

{
  ecs_entity_t component;
  ecs_entity_t eVar1;
  ecs_iter_action_t p_Var2;
  ecs_entity_t eVar3;
  char *pcVar4;
  ecs_c_info_t *peVar5;
  EcsTrigger *pEVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  ecs_table_event_t local_50;
  
  if (0 < count) {
    uVar9 = 0;
    do {
      component = ct->component;
      peVar5 = ecs_get_or_create_c_info(world,component);
      lVar8 = 8;
      if (ct->kind != 0x109) {
        if (ct->kind != 0x10a) {
          _ecs_abort(2,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                     ,0x279);
          abort();
        }
        lVar8 = 0x10;
      }
      pEVar6 = trigger_find_or_create
                         ((ecs_vector_t **)((long)&peVar5->component + lVar8),entities[uVar9]);
      _ecs_assert(pEVar6 != (EcsTrigger *)0x0,0xc,(char *)0x0,"el != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x27d);
      if (pEVar6 == (EcsTrigger *)0x0) {
        __assert_fail("el != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                      ,0x27d,
                      "void trigger_set(ecs_world_t *, const ecs_entity_t *, EcsTrigger *, int32_t)"
                     );
      }
      pEVar6->ctx = ct->ctx;
      eVar1 = ct->kind;
      p_Var2 = ct->action;
      eVar3 = ct->self;
      pEVar6->component = ct->component;
      pEVar6->self = eVar3;
      pEVar6->kind = eVar1;
      pEVar6->action = p_Var2;
      pEVar6->self = entities[uVar9];
      local_50.kind = EcsTableComponentInfo;
      local_50.query = (ecs_query_t *)0x0;
      local_50.matched_table_index = 0;
      local_50.component = component;
      ecs_notify_tables(world,&local_50);
      pcVar4 = "EcsOnRemove";
      if (ct->kind == 0x109) {
        pcVar4 = "EcsOnAdd";
      }
      pcVar7 = ecs_get_name(world,component);
      _ecs_trace(1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                 ,0x28a,"trigger #[green]%s#[normal] created for component #[red]%s",pcVar4 + 3,
                 pcVar7);
      uVar9 = uVar9 + 1;
      ct = ct + 1;
    } while ((uint)count != uVar9);
  }
  return;
}

Assistant:

static
void trigger_set(
    ecs_world_t *world,
    const ecs_entity_t *entities,
    EcsTrigger *ct,
    int32_t count)
{
    EcsTrigger *el = NULL;

    int i;
    for (i = 0; i < count; i ++) {
        ecs_entity_t c = ct[i].component;
        ecs_c_info_t *c_info = ecs_get_or_create_c_info(world, c);

        switch(ct[i].kind) {
        case EcsOnAdd:
            el = trigger_find_or_create(&c_info->on_add, entities[i]);
            break;
        case EcsOnRemove:
            el = trigger_find_or_create(&c_info->on_remove, entities[i]);
            break;
        default:
            ecs_abort(ECS_INVALID_PARAMETER, NULL);
            break;
        }
        
        ecs_assert(el != NULL, ECS_INTERNAL_ERROR, NULL);

        *el = ct[i];
        el->self = entities[i];

        ecs_notify_tables(world, &(ecs_table_event_t) {
            .kind = EcsTableComponentInfo,
            .component = c
        });        

        ecs_trace_1("trigger #[green]%s#[normal] created for component #[red]%s",
            ct[i].kind == EcsOnAdd
                ? "OnAdd"
                : "OnRemove", ecs_get_name(world, c));
    }
}